

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O2

void __thiscall QSizeGrip::mouseMoveEvent(QSizeGrip *this,QMouseEvent *e)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  QWidget *this_00;
  QPoint QVar5;
  int iVar6;
  long in_FS_OFFSET;
  QPointF QVar7;
  QSize local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(e + 0x44) == 1) &&
     (lVar2 = *(long *)&(this->super_QWidget).field_0x8, *(char *)(lVar2 + 0x290) != '\x01')) {
    this_00 = qt_sizegrip_topLevelWidget(&this->super_QWidget);
    if (*(char *)(lVar2 + 0x27c) == '\x01') {
      bVar3 = QWidget::testAttribute_helper(this_00,WA_WState_ConfigPending);
      if (!bVar3) {
        QVar7 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
        uStack_30 = QVar7.yp;
        local_38 = QVar7.xp;
        QVar5 = QPointF::toPoint((QPointF *)&local_38);
        if ((*(uint *)(lVar2 + 0x278) & 0xfffffffe) == 2) {
          iVar6 = QVar5.yp.m_i.m_i - *(int *)(lVar2 + 600);
          if (*(int *)(lVar2 + 0x274) <= iVar6) {
            iVar6 = *(int *)(lVar2 + 0x274);
          }
          iVar6 = (*(int *)(lVar2 + 0x268) - *(int *)(lVar2 + 0x260)) + iVar6;
        }
        else {
          iVar6 = QVar5.yp.m_i.m_i - *(int *)(lVar2 + 600);
          if (iVar6 <= *(int *)(lVar2 + 0x274)) {
            iVar6 = *(int *)(lVar2 + 0x274);
          }
          iVar6 = *(int *)(lVar2 + 0x268) - (*(int *)(lVar2 + 0x260) + iVar6);
        }
        if ((*(uint *)(lVar2 + 0x278) & 0xfffffffd) == 0) {
          iVar4 = QVar5.xp.m_i.m_i - *(int *)(lVar2 + 0x254);
          if (iVar4 <= *(int *)(lVar2 + 0x270)) {
            iVar4 = *(int *)(lVar2 + 0x270);
          }
          iVar4 = *(int *)(lVar2 + 0x264) - (*(int *)(lVar2 + 0x25c) + iVar4);
        }
        else {
          iVar4 = QVar5.xp.m_i.m_i - *(int *)(lVar2 + 0x254);
          if (*(int *)(lVar2 + 0x270) <= iVar4) {
            iVar4 = *(int *)(lVar2 + 0x270);
          }
          iVar4 = (*(int *)(lVar2 + 0x264) - *(int *)(lVar2 + 0x25c)) + iVar4;
        }
        local_40.ht.m_i = iVar6 + 1;
        local_40.wd.m_i = iVar4 + 1;
        local_40 = QLayout::closestAcceptableSize(this_00,&local_40);
        iVar4 = local_40.wd.m_i.m_i + -1;
        iVar6 = local_40.ht.m_i.m_i + -1;
        uVar1 = *(uint *)(lVar2 + 0x278);
        if ((uVar1 & 0xfffffffe) == 2) {
          if ((uVar1 & 1) == 0) {
            uStack_30 = (qreal)CONCAT44(iVar6 + *(int *)(lVar2 + 0x260),*(int *)(lVar2 + 0x264));
            local_38 = (qreal)CONCAT44(*(int *)(lVar2 + 0x260),*(int *)(lVar2 + 0x264) - iVar4);
          }
          else {
            local_38 = *(qreal *)(lVar2 + 0x25c);
            uStack_30 = (qreal)CONCAT44(iVar6 + (int)((ulong)local_38 >> 0x20),
                                        iVar4 + SUB84(local_38,0));
          }
        }
        else if ((uVar1 & 0xfffffffd) == 0) {
          uStack_30 = *(qreal *)(lVar2 + 0x264);
          local_38 = (qreal)CONCAT44((int)((ulong)uStack_30 >> 0x20) - iVar6,
                                     SUB84(uStack_30,0) - iVar4);
        }
        else {
          local_38 = (qreal)CONCAT44(*(int *)(lVar2 + 0x268) - iVar6,*(int *)(lVar2 + 0x25c));
          uStack_30 = (qreal)CONCAT44(*(int *)(lVar2 + 0x268),iVar4 + *(int *)(lVar2 + 0x25c));
        }
        QWidget::setGeometry(this_00,(QRect *)&local_38);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QWidget::mouseMoveEvent(&this->super_QWidget,e);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSizeGrip::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QSizeGrip);
    if (e->buttons() != Qt::LeftButton || d->m_platformSizeGrip) {
        QWidget::mouseMoveEvent(e);
        return;
    }

    QWidget* tlw = qt_sizegrip_topLevelWidget(this);
    if (!d->gotMousePress || tlw->testAttribute(Qt::WA_WState_ConfigPending))
        return;

    QPoint np(e->globalPosition().toPoint());

    // Don't extend beyond the available geometry; bound to dyMax and dxMax.
    QSize ns;
    if (d->atBottom())
        ns.rheight() = d->r.height() + qMin(np.y() - d->p.y(), d->dyMax);
    else
        ns.rheight() = d->r.height() - qMax(np.y() - d->p.y(), d->dyMax);

    if (d->atLeft())
        ns.rwidth() = d->r.width() - qMax(np.x() - d->p.x(), d->dxMax);
    else
        ns.rwidth() = d->r.width() + qMin(np.x() - d->p.x(), d->dxMax);

    ns = QLayout::closestAcceptableSize(tlw, ns);

    QPoint p;
    QRect nr(p, ns);
    if (d->atBottom()) {
        if (d->atLeft())
            nr.moveTopRight(d->r.topRight());
        else
            nr.moveTopLeft(d->r.topLeft());
    } else {
        if (d->atLeft())
            nr.moveBottomRight(d->r.bottomRight());
        else
            nr.moveBottomLeft(d->r.bottomLeft());
    }

    tlw->setGeometry(nr);
}